

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsgbmintegration.cpp
# Opt level: O0

QKmsDevice * __thiscall QEglFSKmsGbmIntegration::createDevice(QEglFSKmsGbmIntegration *this)

{
  bool bVar1;
  QDeviceDiscovery *this_00;
  QDebug *o;
  QString *pQVar2;
  QKmsDevice *pQVar3;
  QEglFSKmsGbmDevice *in_RDI;
  long in_FS_OFFSET;
  QDeviceDiscovery *d;
  QStringList devices;
  QString path;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QKmsScreenConfig *in_stack_fffffffffffffeb8;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_fffffffffffffec0;
  QKmsDevice *path_00;
  QString *in_stack_fffffffffffffec8;
  QDebug *in_stack_fffffffffffffed8;
  QDebug in_stack_ffffffffffffff08;
  char local_f0 [44];
  QFlagsStorage<QDeviceDiscovery::QDeviceType> in_stack_ffffffffffffff3c;
  QDebug local_b0;
  QDebug local_a8;
  QDebug local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  QDebug local_58;
  undefined1 local_50 [24];
  qsizetype local_38;
  ulong local_30;
  undefined8 local_28;
  ulong local_20;
  QMap<QString,_QMap<QString,_QVariant>_> local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_50._0_8_ = (Data *)0xaaaaaaaaaaaaaaaa;
  local_50._8_8_ = (Data *)0xaaaaaaaaaaaaaaaa;
  local_50._16_8_ = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QEglFSKmsIntegration::screenConfig();
  QKmsScreenConfig::devicePath(in_stack_fffffffffffffeb8);
  bVar1 = QString::isEmpty((QString *)0x119bea);
  if (bVar1) {
    QFlags<QDeviceDiscovery::QDeviceType>::QFlags
              ((QFlags<QDeviceDiscovery::QDeviceType> *)in_stack_fffffffffffffec0,
               (QDeviceType)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
    this_00 = QDeviceDiscovery::create((QDeviceTypes)in_stack_ffffffffffffff3c.i,(QObject *)in_RDI);
    local_98 = 0xaaaaaaaaaaaaaaaa;
    local_90 = 0xaaaaaaaaaaaaaaaa;
    local_88 = 0xaaaaaaaaaaaaaaaa;
    (**(code **)(*(long *)this_00 + 0x60))(&local_98);
    local_28._0_4_ = -0x55555556;
    local_28._4_1_ = true;
    local_28._5_1_ = true;
    local_28._6_1_ = true;
    local_28._7_1_ = 0xaa;
    local_20 = 0xaaaaaaaaaaaaaaaa;
    QtPrivateLogging::qLcEglfsKmsDebug();
    anon_unknown.dwarf_612a7::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
              (in_stack_fffffffffffffec0,(QLoggingCategory *)in_stack_fffffffffffffeb8);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_28), bVar1) {
      anon_unknown.dwarf_612a7::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x119d85);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_RDI,(char *)in_stack_fffffffffffffec8,
                 (int)((ulong)in_stack_fffffffffffffec0 >> 0x20),(char *)in_stack_fffffffffffffeb8,
                 (char *)0x119d9b);
      QMessageLogger::debug();
      o = QDebug::operator<<((QDebug *)this_00,(char *)in_stack_ffffffffffffff08.stream);
      QDebug::QDebug(&local_a8,o);
      ::operator<<((QDebug *)this_00,(QList<QString> *)in_RDI);
      QDebug::~QDebug(&local_a0);
      QDebug::~QDebug(&local_a8);
      QDebug::~QDebug(&local_b0);
      local_20 = local_20 & 0xffffffffffffff00;
    }
    QObject::deleteLater();
    bVar1 = QList<QString>::isEmpty((QList<QString> *)0x119e39);
    if (bVar1) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_RDI,(char *)in_stack_fffffffffffffec8,
                 (int)((ulong)in_stack_fffffffffffffec0 >> 0x20),(char *)in_stack_fffffffffffffeb8);
      QMessageLogger::fatal(local_f0,"Could not find DRM device!");
    }
    pQVar2 = QList<QString>::first((QList<QString> *)in_stack_fffffffffffffec0);
    QString::operator=((QString *)local_50,(QString *)pQVar2);
    local_38 = -0x5555555555555556;
    local_30 = 0xaaaaaaaaaaaaaaaa;
    QtPrivateLogging::qLcEglfsKmsDebug();
    anon_unknown.dwarf_612a7::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
              (in_stack_fffffffffffffec0,(QLoggingCategory *)in_stack_fffffffffffffeb8);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_38), bVar1) {
      anon_unknown.dwarf_612a7::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x119ed9);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_RDI,(char *)in_stack_fffffffffffffec8,
                 (int)((ulong)in_stack_fffffffffffffec0 >> 0x20),(char *)in_stack_fffffffffffffeb8,
                 (char *)0x119eef);
      QMessageLogger::debug();
      QDebug::operator<<((QDebug *)this_00,(char *)in_stack_ffffffffffffff08.stream);
      QDebug::operator<<((QDebug *)in_RDI,in_stack_fffffffffffffec8);
      QDebug::~QDebug((QDebug *)&stack0xffffffffffffff08);
      local_30 = local_30 & 0xffffffffffffff00;
    }
    QList<QString>::~QList((QList<QString> *)0x119f40);
  }
  else {
    local_18.d.d.ptr =
         (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>_>
          )(totally_ordered_wrapper<QMapData<std::map<QString,_QMap<QString,_QVariant>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMap<QString,_QVariant>_>_>_>_>_*>
            )0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    QtPrivateLogging::qLcEglfsKmsDebug();
    anon_unknown.dwarf_612a7::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
              (in_stack_fffffffffffffec0,(QLoggingCategory *)in_stack_fffffffffffffeb8);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_612a7::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x119c48);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_RDI,(char *)in_stack_fffffffffffffec8,
                 (int)((ulong)in_stack_fffffffffffffec0 >> 0x20),(char *)in_stack_fffffffffffffeb8,
                 (char *)0x119c61);
      QMessageLogger::debug();
      QDebug::operator<<(in_stack_fffffffffffffed8,(char *)in_stack_ffffffffffffff08.stream);
      QDebug::operator<<((QDebug *)in_RDI,in_stack_fffffffffffffec8);
      QDebug::operator<<(in_stack_fffffffffffffed8,(char *)in_stack_ffffffffffffff08.stream);
      QDebug::~QDebug(&local_58);
      local_10 = local_10 & 0xffffffffffffff00;
    }
  }
  pQVar3 = (QKmsDevice *)operator_new(0x70);
  path_00 = pQVar3;
  QEglFSKmsIntegration::screenConfig();
  QEglFSKmsGbmDevice::QEglFSKmsGbmDevice(in_RDI,(QKmsScreenConfig *)local_50,(QString *)path_00);
  QString::~QString((QString *)0x119f81);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return pQVar3;
}

Assistant:

QKmsDevice *QEglFSKmsGbmIntegration::createDevice()
{
    QString path = screenConfig()->devicePath();
    if (!path.isEmpty()) {
        qCDebug(qLcEglfsKmsDebug) << "GBM: Using DRM device" << path << "specified in config file";
    } else {
        QDeviceDiscovery *d = QDeviceDiscovery::create(QDeviceDiscovery::Device_VideoMask);
        const QStringList devices = d->scanConnectedDevices();
        qCDebug(qLcEglfsKmsDebug) << "Found the following video devices:" << devices;
        d->deleteLater();

        if (Q_UNLIKELY(devices.isEmpty()))
            qFatal("Could not find DRM device!");

        path = devices.first();
        qCDebug(qLcEglfsKmsDebug) << "Using" << path;
    }

    return new QEglFSKmsGbmDevice(screenConfig(), path);
}